

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ScaleLayerParams::ScaleLayerParams
          (ScaleLayerParams *this,ScaleLayerParams *from)

{
  ulong uVar1;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ScaleLayerParams_00489170;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->shapescale_,&from->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->shapebias_,&from->shapebias_)
  ;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  pWVar2 = from->scale_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)_ScaleLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->scale_ = pWVar3;
  pWVar2 = from->bias_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)_ScaleLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x48);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->bias_ = pWVar3;
  this->hasbias_ = from->hasbias_;
  return;
}

Assistant:

ScaleLayerParams::ScaleLayerParams(const ScaleLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      shapescale_(from.shapescale_),
      shapebias_(from.shapebias_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_scale()) {
    scale_ = new ::CoreML::Specification::WeightParams(*from.scale_);
  } else {
    scale_ = nullptr;
  }
  if (from._internal_has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = nullptr;
  }
  hasbias_ = from.hasbias_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ScaleLayerParams)
}